

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMeshFileLoader.cpp
# Opt level: O1

void chrono::fea::ChMeshFileLoader::ANCFShellFromGMFFile
               (shared_ptr<chrono::fea::ChMesh> *mesh,char *filename,
               shared_ptr<chrono::fea::ChMaterialShellANCF> *my_material,
               vector<double,_std::allocator<double>_> *node_ave_area,
               vector<int,_std::allocator<int>_> *Boundary_nodes,ChVector<double> *pos_transform,
               ChMatrix33<double> *rot_transform,double scaleFactor,bool printNodes,
               bool printElements)

{
  size_type __new_size;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int *piVar23;
  element_type *peVar24;
  double *pdVar25;
  iterator __position;
  long lVar26;
  ChMesh *pCVar27;
  element_type *peVar28;
  double dVar29;
  undefined8 uVar30;
  bool bVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  _Alloc_hider _Var39;
  char cVar40;
  char cVar41;
  uint uVar42;
  int iVar43;
  undefined4 extraout_var;
  istream *piVar44;
  undefined4 extraout_var_00;
  ChLog *pCVar45;
  ChStreamOutAscii *pCVar46;
  ChElementShellANCF_3423 *this;
  ostream *poVar47;
  ChException *pCVar48;
  long *plVar49;
  char *pcVar50;
  size_type *psVar51;
  int iVar52;
  int i;
  long lVar53;
  ulong uVar54;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar55;
  ulong uVar56;
  uint uVar57;
  _Alloc_hider _Var58;
  size_type sVar59;
  long lVar60;
  undefined1 uVar61;
  bool bVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  double dVar72;
  double dVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  string line;
  ChVector<double> node_position;
  shared_ptr<chrono::fea::ChNodeFEAxyzD> node;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  elementsVector;
  ChMatrixDynamic<double> nodesXYZ;
  vector<int,_std::allocator<int>_> num_Normals;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> Normals;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  elementsdxdy;
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
  nodesVector;
  ChMatrixDynamic<int> NumBEdges;
  istringstream ss;
  istringstream stoken;
  ifstream fin;
  ChNodeFEAxyzD *local_868;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_860;
  undefined1 local_858 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_838;
  undefined1 local_811;
  ulong local_810;
  shared_ptr<chrono::fea::ChMesh> *local_808;
  double local_800;
  ulong local_7f8;
  ChVector<double> local_7f0;
  value_type local_7d8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_7c8;
  DenseStorage<double,__1,__1,__1,_1> local_7a8;
  double local_790;
  vector<int,_std::allocator<int>_> *local_788;
  double local_780;
  vector<int,_std::allocator<int>_> local_778;
  undefined1 local_758 [16];
  shared_ptr<chrono::fea::ChNodeFEAxyzD> local_748;
  shared_ptr<chrono::fea::ChNodeFEAxyzD> local_738;
  shared_ptr<chrono::fea::ChNodeFEAxyzD> local_728;
  shared_ptr<chrono::fea::ChNodeFEAxyzD> local_718;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> local_708;
  vector<double,_std::allocator<double>_> *local_6f0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_6e8;
  shared_ptr<chrono::fea::ChElementBase> local_6c8;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_6b8;
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
  local_6a8;
  DenseStorage<int,__1,__1,__1,_1> local_688;
  undefined1 local_668 [16];
  double local_658;
  undefined8 uStack_650;
  long local_648;
  undefined8 uStack_640;
  long local_638;
  undefined8 uStack_630;
  long local_628;
  undefined8 uStack_620;
  long local_618;
  undefined8 uStack_610;
  long local_608;
  undefined8 uStack_600;
  long local_5f8;
  undefined8 uStack_5f0;
  ulong local_5e8;
  ulong local_5e0;
  size_type local_5d8;
  ChVector<double> *local_5d0;
  double local_5c8;
  double local_5c0;
  string local_5b8;
  string local_598;
  string local_578;
  string local_558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538 [3];
  ios_base local_4c0 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8 [3];
  ios_base local_340 [264];
  long local_238 [4];
  int aiStack_218 [122];
  
  local_808 = mesh;
  local_788 = Boundary_nodes;
  local_780 = scaleFactor;
  local_6f0 = node_ave_area;
  local_5d0 = pos_transform;
  uVar42 = (*(((mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3c])();
  local_858._24_8_ = CONCAT44(extraout_var,uVar42);
  printf("Current number of nodes in mesh is %d \n",(ulong)uVar42);
  local_7a8.m_data = (double *)0x0;
  local_7a8.m_rows = 0;
  local_7a8.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_7a8,4,1,4);
  local_688.m_data = (int *)0x0;
  local_688.m_rows = 0;
  local_688.m_cols = 0;
  Eigen::DenseStorage<int,_-1,_-1,_-1,_1>::resize(&local_688,3,1,3);
  local_708.super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_708.super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_708.super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_778.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_778.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_778.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_6a8.
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6a8.
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8.
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_7c8.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_7c8.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_7c8.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6e8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6e8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6e8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::ifstream::ifstream(local_238,filename,_S_in);
  if (*(int *)((long)aiStack_218 + *(long *)(local_238[0] + -0x18)) != 0) {
    pCVar48 = (ChException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)local_3b8,filename,(allocator *)&local_838);
    std::operator+(local_538,"ERROR opening Mesh file: ",local_3b8);
    plVar49 = (long *)std::__cxx11::string::append((char *)local_538);
    local_558._M_dataplus._M_p = (pointer)*plVar49;
    psVar51 = (size_type *)(plVar49 + 2);
    if ((size_type *)local_558._M_dataplus._M_p == psVar51) {
      local_558.field_2._M_allocated_capacity = *psVar51;
      local_558.field_2._8_8_ = plVar49[3];
      local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
    }
    else {
      local_558.field_2._M_allocated_capacity = *psVar51;
    }
    local_558._M_string_length = plVar49[1];
    *plVar49 = (long)psVar51;
    plVar49[1] = 0;
    *(undefined1 *)(plVar49 + 2) = 0;
    ChException::ChException(pCVar48,&local_558);
    __cxa_throw(pCVar48,&ChException::typeinfo,ChException::~ChException);
  }
  local_838._M_dataplus._M_p = (pointer)&local_838.field_2;
  local_838._M_string_length = 0;
  local_838.field_2._M_local_buf[0] = '\0';
  local_5f8 = 0;
  uStack_5f0 = 0;
  local_608 = 0;
  uStack_600 = 0;
  local_618 = 0;
  uStack_610 = 0;
  local_628 = 0;
  uStack_620 = 0;
  local_638 = 0;
  uStack_630 = 0;
  local_648 = 0;
  uStack_640 = 0;
  local_858._20_4_ = 0;
  local_810 = 0;
  local_7f8 = 0;
  do {
    cVar40 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                             (char)(istream *)local_238);
    piVar44 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)local_238,(string *)&local_838,cVar40);
    _Var39._M_p = local_838._M_dataplus._M_p;
    if (((byte)piVar44[*(long *)(*(long *)piVar44 + -0x18) + 0x20] & 5) != 0) {
      printf("Mesh Bounding box is x [%f %f %f %f %f %f]\n",local_648,local_638,local_628,local_618,
             local_608,local_5f8);
      pCVar45 = GetLog();
      ChStreamOutAscii::operator<<
                (&pCVar45->super_ChStreamOutAscii,
                 "-----------------------------------------------------------\n\n");
      if (0 < (int)local_810) {
        iVar43 = (int)local_858._24_8_;
        uVar54 = local_810 & 0xffffffff;
        lVar60 = 0x10;
        lVar53 = 0;
        uVar56 = local_858._24_8_ & 0xffffffff;
        do {
          dVar72 = 1.0 / (double)*(int *)((long)local_778.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start + lVar53);
          local_538[0]._M_dataplus._M_p =
               (pointer)(dVar72 * *(double *)
                                   ((long)(local_708.
                                           super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->m_data +
                                   lVar60 + -0x10));
          local_538[0]._M_string_length =
               (size_type)
               (dVar72 * *(double *)
                          ((long)(local_708.
                                  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar60 + -8))
          ;
          local_538[0].field_2._0_8_ =
               dVar72 * *(double *)
                         ((long)(local_708.
                                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar60);
          auVar63._8_8_ = 0;
          auVar63._0_8_ =
               *(ulong *)((long)(local_708.
                                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar60 + -0x10
                         );
          dVar72 = *(double *)
                    ((long)(local_708.
                            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar60 + -8);
          auVar65._8_8_ = 0;
          auVar65._0_8_ = dVar72 * dVar72;
          auVar63 = vfmadd231sd_fma(auVar65,auVar63,auVar63);
          auVar64._8_8_ = 0;
          auVar64._0_8_ =
               *(ulong *)((long)(local_708.
                                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar60);
          auVar63 = vfmadd213sd_fma(auVar64,auVar64,auVar63);
          if (auVar63._0_8_ < 0.0) {
            dVar72 = sqrt(auVar63._0_8_);
          }
          else {
            auVar63 = vsqrtsd_avx(auVar63,auVar63);
            dVar72 = auVar63._0_8_;
          }
          *(double *)
           ((long)(local_6f0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start + lVar53 * 2 + (long)iVar43 * 8) = dVar72 * 0.25;
          iVar52 = (int)uVar56;
          if (*(int *)((long)local_778.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar53) < 3) {
            local_3b8[0]._M_dataplus._M_p._0_4_ = iVar52;
            __position._M_current =
                 (local_788->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (local_788->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (local_788,__position,(int *)local_3b8);
            }
            else {
              *__position._M_current = iVar52;
              (local_788->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
          }
          auVar66._8_8_ = 0;
          auVar66._0_8_ = local_538[0]._M_dataplus._M_p;
          auVar68._8_8_ = 0;
          auVar68._0_8_ =
               (double)local_538[0]._M_string_length * (double)local_538[0]._M_string_length;
          auVar63 = vfmadd231sd_fma(auVar68,auVar66,auVar66);
          auVar67._8_8_ = 0;
          auVar67._0_8_ = local_538[0].field_2._M_allocated_capacity;
          auVar63 = vfmadd213sd_fma(auVar67,auVar67,auVar63);
          if (auVar63._0_8_ < 0.0) {
            dVar72 = sqrt(auVar63._0_8_);
          }
          else {
            auVar63 = vsqrtsd_avx(auVar63,auVar63);
            dVar72 = auVar63._0_8_;
          }
          if (dVar72 < 2.2250738585072014e-308) {
            local_538[0]._M_dataplus._M_p = (pointer)0x3ff0000000000000;
            local_538[0]._M_string_length = 0;
            local_538[0].field_2._0_8_ = 0.0;
          }
          else {
            dVar72 = 1.0 / dVar72;
            local_538[0]._M_dataplus._M_p = (pointer)(dVar72 * local_538[0]._M_dataplus._M_p);
            local_538[0]._M_string_length =
                 (size_type)(dVar72 * (double)local_538[0]._M_string_length);
            local_538[0].field_2._0_8_ = dVar72 * (double)local_538[0].field_2._0_8_;
          }
          lVar26 = *(long *)((long)&((local_6a8.
                                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr + lVar53 * 4);
          local_3b8[0]._M_dataplus._M_p = *(pointer *)(lVar26 + 0x20);
          local_3b8[0]._M_string_length = *(undefined8 *)(lVar26 + 0x28);
          local_3b8[0].field_2._0_8_ = *(size_type *)(lVar26 + 0x30);
          local_868 = (ChNodeFEAxyzD *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<chrono::fea::ChNodeFEAxyzD,std::allocator<chrono::fea::ChNodeFEAxyzD>,chrono::ChVector<double>&,chrono::ChVector<double>&>
                    (&local_860,&local_868,(allocator<chrono::fea::ChNodeFEAxyzD> *)&local_7f0,
                     (ChVector<double> *)local_3b8,(ChVector<double> *)local_538);
          (*(local_868->super_ChNodeFEAxyz).super_ChNodeFEAbase._vptr_ChNodeFEAbase[10])();
          pCVar27 = (local_808->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)
                    ._M_ptr;
          local_6b8.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)local_868;
          local_6b8.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = local_860._M_pi;
          if (local_860._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_860._M_pi)->_M_use_count = (local_860._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_860._M_pi)->_M_use_count = (local_860._M_pi)->_M_use_count + 1;
            }
          }
          ChMesh::AddNode(pCVar27,&local_6b8);
          if (local_6b8.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_6b8.
                       super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (printNodes) {
            pCVar45 = GetLog();
            pCVar46 = ChStreamOutAscii::operator<<
                                (&pCVar45->super_ChStreamOutAscii,
                                 *(double *)
                                  &(local_868->super_ChNodeFEAxyz).super_ChNodeFEAbase.field_0x20);
            pCVar46 = ChStreamOutAscii::operator<<(pCVar46,"  ");
            pCVar46 = ChStreamOutAscii::operator<<
                                (pCVar46,*(double *)&(local_868->super_ChNodeFEAxyz).field_0x28);
            pCVar46 = ChStreamOutAscii::operator<<(pCVar46,"  ");
            pCVar46 = ChStreamOutAscii::operator<<
                                (pCVar46,*(double *)&(local_868->super_ChNodeFEAxyz).field_0x30);
            ChStreamOutAscii::operator<<(pCVar46,"\n");
          }
          if (local_860._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_860._M_pi);
          }
          uVar56 = (ulong)(iVar52 + 1);
          lVar53 = lVar53 + 4;
          lVar60 = lVar60 + 0x18;
        } while (uVar54 << 2 != lVar53);
      }
      pCVar45 = GetLog();
      pcVar50 = "-----------------------------------------------------------\n";
      ChStreamOutAscii::operator<<
                (&pCVar45->super_ChStreamOutAscii,
                 "-----------------------------------------------------------\n");
      if (0 < (int)local_858._20_4_) {
        local_858._24_8_ = ZEXT48((int)local_858._24_8_ - 1);
        local_780 = (double)(ulong)(uint)local_858._20_4_;
        dVar72 = 0.0;
        do {
          this = (ChElementShellANCF_3423 *)
                 ChElementShellANCF_3423::operator_new
                           ((ChElementShellANCF_3423 *)0x3200,(size_t)pcVar50);
          ChElementShellANCF_3423::ChElementShellANCF_3423(this);
          local_538[0]._M_dataplus._M_p = (pointer)this;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<chrono::fea::ChElementShellANCF_3423*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_538[0]._M_string_length,
                     this);
          _Var39._M_p = local_538[0]._M_dataplus._M_p;
          peVar28 = (local_808->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)
                    ._M_ptr;
          (*(peVar28->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3d])
                    (local_3b8,peVar28,
                     (ulong)(uint)(*local_7c8.
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[(long)dVar72].
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start + local_858._24_4_));
          if (local_3b8[0]._M_dataplus._M_p == (pointer)0x0) {
            local_718.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)0x0;
          }
          else {
            local_718.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)
                     __dynamic_cast(local_3b8[0]._M_dataplus._M_p,&ChNodeBase::typeinfo,
                                    &ChNodeFEAxyzD::typeinfo,0xffffffffffffffff);
          }
          if (local_718.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr == (element_type *)0x0) {
            local_718.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)0x0;
            local_718.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          else {
            local_718.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8[0]._M_string_length;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8[0]._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(local_3b8[0]._M_string_length + 8) =
                     *(_Atomic_word *)(local_3b8[0]._M_string_length + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)(local_3b8[0]._M_string_length + 8) =
                     *(_Atomic_word *)(local_3b8[0]._M_string_length + 8) + 1;
              }
            }
          }
          peVar28 = (local_808->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)
                    ._M_ptr;
          (*(peVar28->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3d])
                    (&local_868,peVar28,
                     (ulong)(uint)(local_7c8.
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[(long)dVar72].
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[1] + local_858._24_4_));
          if (local_868 == (ChNodeFEAxyzD *)0x0) {
            local_728.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)0x0;
          }
          else {
            local_728.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)
                     __dynamic_cast(local_868,&ChNodeBase::typeinfo,&ChNodeFEAxyzD::typeinfo,
                                    0xffffffffffffffff);
          }
          if (local_728.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr == (element_type *)0x0) {
            local_728.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)0x0;
            local_728.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          else {
            local_728.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = local_860._M_pi;
            if (local_860._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_860._M_pi)->_M_use_count = (local_860._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_860._M_pi)->_M_use_count = (local_860._M_pi)->_M_use_count + 1;
              }
            }
          }
          peVar28 = (local_808->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)
                    ._M_ptr;
          (*(peVar28->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3d])
                    (&local_7f0,peVar28,
                     (ulong)(uint)(local_7c8.
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[(long)dVar72].
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[2] + local_858._24_4_));
          if ((_func_int **)local_7f0.m_data[0] == (_func_int **)0x0) {
            local_738.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)0x0;
          }
          else {
            local_738.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)
                     __dynamic_cast(local_7f0.m_data[0],&ChNodeBase::typeinfo,
                                    &ChNodeFEAxyzD::typeinfo,0xffffffffffffffff);
          }
          if (local_738.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr == (element_type *)0x0) {
            local_738.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)0x0;
            local_738.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          else {
            local_738.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_7f0.m_data[1];
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_7f0.m_data[1] !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)((long)local_7f0.m_data[1] + 8) =
                     *(_Atomic_word *)((long)local_7f0.m_data[1] + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)((long)local_7f0.m_data[1] + 8) =
                     *(_Atomic_word *)((long)local_7f0.m_data[1] + 8) + 1;
              }
            }
          }
          peVar28 = (local_808->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)
                    ._M_ptr;
          (*(peVar28->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3d])
                    (&local_7d8,peVar28,
                     (ulong)(uint)(local_7c8.
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[(long)dVar72].
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[3] + local_858._24_4_));
          if (local_7d8.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr == (element_type *)0x0) {
            local_748.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)0x0;
          }
          else {
            local_748.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)
                     __dynamic_cast(local_7d8.
                                    super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr,&ChNodeBase::typeinfo,&ChNodeFEAxyzD::typeinfo,
                                    0xffffffffffffffff);
          }
          if (local_748.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr == (element_type *)0x0) {
            local_748.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)0x0;
            local_748.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          else {
            local_748.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi =
                 local_7d8.
                 super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
            if (local_7d8.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_7d8.
                 super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_7d8.
                      super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_7d8.
                 super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_7d8.
                      super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
          }
          ChElementShellANCF_3423::SetNodes
                    ((ChElementShellANCF_3423 *)_Var39._M_p,&local_718,&local_728,&local_738,
                     &local_748);
          if (local_748.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_748.
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_7d8.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_7d8.
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_738.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_738.
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_7f0.m_data[1] !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_7f0.m_data[1]);
          }
          if (local_728.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_728.
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_860._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_860._M_pi);
          }
          if (local_718.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_718.
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8[0]._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8[0]._M_string_length
                      );
          }
          pdVar25 = local_6e8.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[(long)dVar72].
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          dVar73 = pdVar25[1];
          *(double *)(local_538[0]._M_dataplus._M_p + 0x90) = *pdVar25;
          *(double *)(local_538[0]._M_dataplus._M_p + 0x98) = dVar73;
          pCVar27 = (local_808->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)
                    ._M_ptr;
          local_6c8.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)local_538[0]._M_dataplus._M_p;
          local_6c8.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_538[0]._M_string_length;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_538[0]._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)(local_538[0]._M_string_length + 8) =
                   *(_Atomic_word *)(local_538[0]._M_string_length + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)(local_538[0]._M_string_length + 8) =
                   *(_Atomic_word *)(local_538[0]._M_string_length + 8) + 1;
            }
          }
          pcVar50 = (char *)&local_6c8;
          ChMesh::AddElement(pCVar27,(shared_ptr<chrono::fea::ChElementBase> *)pcVar50);
          if (local_6c8.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_6c8.
                       super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (printElements) {
            poVar47 = (ostream *)std::ostream::operator<<(&std::cout,SUB84(dVar72,0));
            std::__ostream_insert<char,std::char_traits<char>>(poVar47," ",1);
            lVar53 = 0;
            do {
              poVar47 = (ostream *)
                        std::ostream::operator<<
                                  (&std::cout,
                                   local_7c8.
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[(long)dVar72].
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[lVar53]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar47," ",1);
              lVar53 = lVar53 + 1;
            } while (lVar53 != 4);
            cVar40 = std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
            pcVar50 = (char *)(ulong)(uint)(int)cVar40;
            std::ostream::put(-0x20);
            std::ostream::flush();
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_538[0]._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_538[0]._M_string_length
                      );
          }
          dVar72 = (double)((long)dVar72 + 1);
        } while (dVar72 != local_780);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_838._M_dataplus._M_p != &local_838.field_2) {
        operator_delete(local_838._M_dataplus._M_p,
                        CONCAT71(local_838.field_2._M_allocated_capacity._1_7_,
                                 local_838.field_2._M_local_buf[0]) + 1);
      }
      std::ifstream::~ifstream(local_238);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector(&local_6e8);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_7c8);
      std::
      vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
      ::~vector(&local_6a8);
      if (local_778.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_778.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_778.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_778.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_708.
          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_708.
                        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_708.
                              super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_708.
                              super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_688.m_data != (int *)0x0) {
        free(*(void **)(local_688.m_data + -2));
      }
      if (local_7a8.m_data != (double *)0x0) {
        free((void *)local_7a8.m_data[-1]);
      }
      return;
    }
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_838._M_dataplus._M_p + local_838._M_string_length);
    _Var58._M_p = local_838._M_dataplus._M_p;
    if (0 < (long)local_838._M_string_length >> 2) {
      _Var58._M_p = local_838._M_dataplus._M_p + (local_838._M_string_length & 0xfffffffffffffffc);
      lVar53 = ((long)local_838._M_string_length >> 2) + 1;
      paVar55 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_838._M_dataplus._M_p + 3);
      do {
        iVar43 = isspace((uint)(byte)paVar55->_M_local_buf[-3]);
        if (iVar43 == 0) {
          paVar55 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(paVar55->_M_local_buf + -3);
          goto LAB_0061d0ae;
        }
        iVar43 = isspace((uint)(byte)paVar55->_M_local_buf[-2]);
        if (iVar43 == 0) {
          paVar55 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(paVar55->_M_local_buf + -2);
          goto LAB_0061d0ae;
        }
        iVar43 = isspace((uint)(byte)paVar55->_M_local_buf[-1]);
        if (iVar43 == 0) {
          paVar55 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(paVar55->_M_local_buf + -1);
          goto LAB_0061d0ae;
        }
        iVar43 = isspace((uint)(byte)paVar55->_M_local_buf[0]);
        if (iVar43 == 0) goto LAB_0061d0ae;
        lVar53 = lVar53 + -1;
        paVar55 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar55->_M_local_buf + 4);
      } while (1 < lVar53);
    }
    lVar53 = (long)paVar1 - (long)_Var58._M_p;
    if (lVar53 == 1) {
LAB_0061d09c:
      iVar43 = isspace((uint)(byte)*_Var58._M_p);
      paVar55 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var58._M_p;
      if (iVar43 != 0) {
        paVar55 = paVar1;
      }
    }
    else if (lVar53 == 2) {
LAB_0061d069:
      iVar43 = isspace((uint)(byte)*_Var58._M_p);
      paVar55 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var58._M_p;
      if (iVar43 != 0) {
        _Var58._M_p = _Var58._M_p + 1;
        goto LAB_0061d09c;
      }
    }
    else {
      paVar55 = paVar1;
      if ((lVar53 == 3) &&
         (iVar43 = isspace((uint)(byte)*_Var58._M_p),
         paVar55 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)_Var58._M_p, iVar43 != 0)) {
        _Var58._M_p = _Var58._M_p + 1;
        goto LAB_0061d069;
      }
    }
LAB_0061d0ae:
    if (paVar1 == paVar55) {
      local_838._M_string_length = 0;
      *_Var39._M_p = 0;
    }
    else {
      std::__cxx11::string::_M_erase((ulong)&local_838,0);
    }
    if (*local_838._M_dataplus._M_p != 0) {
      lVar53 = std::__cxx11::string::find((char *)&local_838,0x999403,0);
      if (lVar53 == 0) {
        cVar40 = (char)(istream *)local_238;
        cVar41 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + cVar40);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_238,(string *)&local_838,cVar41);
        uVar42 = atoi(local_838._M_dataplus._M_p);
        local_810 = CONCAT44(extraout_var_00,uVar42);
        printf("Found  %d nodes\n",(ulong)uVar42);
        pCVar45 = GetLog();
        ChStreamOutAscii::operator<<
                  (&pCVar45->super_ChStreamOutAscii,"Parsing information from \"Vertices\" \n");
        cVar40 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + cVar40);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_238,(string *)&local_838,cVar40);
        sVar59 = (size_type)(int)local_810;
        std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::resize
                  (&local_708,sVar59);
        std::vector<double,_std::allocator<double>_>::resize
                  (local_6f0,(long)((int)local_858._24_8_ + (int)local_810));
        std::vector<int,_std::allocator<int>_>::resize(&local_778,sVar59);
        if (0 < (int)local_810) {
          local_790 = (double)CONCAT44(local_790._4_4_,(int)local_810 + (int)local_7f8);
          iVar43 = 0;
          do {
            local_868 = (ChNodeFEAxyzD *)local_858;
            local_860._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_858[0] = 0;
            std::__cxx11::istringstream::istringstream
                      ((istringstream *)local_538,(string *)&local_838,_S_in);
            lVar60 = 0;
            for (lVar53 = -4;
                (piVar44 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                     ((istream *)local_538,(string *)&local_868,' '),
                ((byte)piVar44[*(long *)(*(long *)piVar44 + -0x18) + 0x20] & 5) == 0 &&
                (uVar56 = lVar53 + 4, uVar56 < 0x14)); lVar53 = lVar53 + 1) {
              std::__cxx11::istringstream::istringstream
                        ((istringstream *)local_3b8,(string *)&local_868,_S_in);
              if (((local_7a8.m_rows < 1) || (local_7a8.m_cols <= (long)uVar56)) ||
                 ((std::istream::_M_extract<double>((double *)local_3b8), local_7a8.m_rows < 1 ||
                  (local_7a8.m_cols <= (long)uVar56)))) goto LAB_0061e73a;
              *(double *)((long)local_7a8.m_data + lVar60) =
                   local_780 * *(double *)((long)local_7a8.m_data + lVar60);
              std::__cxx11::istringstream::~istringstream((istringstream *)local_3b8);
              std::ios_base::~ios_base(local_340);
              lVar60 = lVar60 + 8;
            }
            if ((local_7a8.m_rows < 1) ||
               (((local_7a8.m_cols < 1 || ((double)local_7a8.m_cols == 4.94065645841247e-324)) ||
                (local_7a8.m_cols < 3)))) {
LAB_0061e73a:
              pcVar50 = 
              "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>, Level = 1]"
              ;
LAB_0061e766:
              __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                            "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,pcVar50);
            }
            local_668._8_8_ = 0;
            local_668._0_8_ = *local_7a8.m_data;
            local_658 = local_7a8.m_data[1];
            local_758._8_8_ = 0;
            local_758._0_8_ = local_7a8.m_data[2];
            auVar12._8_8_ = 0;
            auVar12._0_8_ =
                 (rot_transform->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
            auVar74._8_8_ = 0;
            auVar74._0_8_ =
                 local_658 *
                 (rot_transform->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
            auVar63 = vfmadd231sd_fma(auVar74,local_668,auVar12);
            auVar13._8_8_ = 0;
            auVar13._0_8_ =
                 (rot_transform->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
            auVar63 = vfmadd231sd_fma(auVar63,local_758,auVar13);
            auVar14._8_8_ = 0;
            auVar14._0_8_ =
                 (rot_transform->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
            auVar81._8_8_ = 0;
            auVar81._0_8_ =
                 local_658 *
                 (rot_transform->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
            auVar64 = vfmadd231sd_fma(auVar81,local_668,auVar14);
            auVar15._8_8_ = 0;
            auVar15._0_8_ =
                 (rot_transform->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
            auVar64 = vfmadd231sd_fma(auVar64,local_758,auVar15);
            uStack_650 = 0;
            auVar16._8_8_ = 0;
            auVar16._0_8_ =
                 (rot_transform->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
            auVar86._8_8_ = 0;
            auVar86._0_8_ =
                 local_658 *
                 (rot_transform->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7];
            auVar65 = vfmadd231sd_fma(auVar86,local_668,auVar16);
            auVar17._8_8_ = 0;
            auVar17._0_8_ =
                 (rot_transform->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
            auVar65 = vfmadd231sd_fma(auVar65,local_758,auVar17);
            local_7f0.m_data[0] = auVar63._0_8_ + local_5d0->m_data[0];
            local_7f0.m_data[1] = auVar64._0_8_ + local_5d0->m_data[1];
            local_7f0.m_data[2] = auVar65._0_8_ + local_5d0->m_data[2];
            local_3b8[0]._M_dataplus._M_p = (pointer)0x3ff0000000000000;
            local_3b8[0]._M_string_length = 0x3ff0000000000000;
            local_3b8[0].field_2._M_allocated_capacity = 0x3ff0000000000000;
            local_7d8.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<chrono::fea::ChNodeFEAxyzD,std::allocator<chrono::fea::ChNodeFEAxyzD>,chrono::ChVector<double>&,chrono::ChVector<double>>
                      (&local_7d8.
                        super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,(ChNodeFEAxyzD **)&local_7d8,
                       (allocator<chrono::fea::ChNodeFEAxyzD> *)&local_811,&local_7f0,
                       (ChVector<double> *)local_3b8);
            std::
            vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
            ::push_back(&local_6a8,&local_7d8);
            bVar62 = (int)local_7f8 == 0;
            if (lVar60 != 0x20) {
              pCVar48 = (ChException *)__cxa_allocate_exception(0x28);
              std::operator+(local_3b8,
                             "ERROR in .mesh file, Quadrilaterals require 4 node IDs, see line:\n",
                             &local_838);
              plVar49 = (long *)std::__cxx11::string::append((char *)local_3b8);
              local_578._M_dataplus._M_p = (pointer)*plVar49;
              psVar51 = (size_type *)(plVar49 + 2);
              if ((size_type *)local_578._M_dataplus._M_p == psVar51) {
                local_578.field_2._M_allocated_capacity = *psVar51;
                local_578.field_2._8_8_ = plVar49[3];
                local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
              }
              else {
                local_578.field_2._M_allocated_capacity = *psVar51;
              }
              local_578._M_string_length = plVar49[1];
              *plVar49 = (long)psVar51;
              plVar49[1] = 0;
              *(undefined1 *)(plVar49 + 2) = 0;
              ChException::ChException(pCVar48,&local_578);
              __cxa_throw(pCVar48,&ChException::typeinfo,ChException::~ChException);
            }
            cVar40 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)local_238);
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)local_238,(string *)&local_838,cVar40);
            if (local_7d8.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_7d8.
                         super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            std::__cxx11::istringstream::~istringstream((istringstream *)local_538);
            std::ios_base::~ios_base(local_4c0);
            if (local_868 != (ChNodeFEAxyzD *)local_858) {
              operator_delete(local_868,CONCAT71(local_858._1_7_,local_858[0]) + 1);
            }
            auVar33._8_8_ = uStack_640;
            auVar33._0_8_ = local_648;
            uVar30 = vcmpsd_avx512f(local_668,auVar33,1);
            bVar31 = (bool)((byte)uVar30 & 1);
            lVar53 = local_668._0_8_;
            local_648 = (ulong)bVar31 * lVar53 +
                        (ulong)!bVar31 * ((ulong)bVar62 * lVar53 + (ulong)!bVar62 * local_648);
            auVar34._8_8_ = uStack_630;
            auVar34._0_8_ = local_638;
            uVar30 = vcmpsd_avx512f(auVar34,local_668,1);
            bVar31 = (bool)((byte)uVar30 & 1);
            local_638 = (ulong)bVar31 * lVar53 +
                        (ulong)!bVar31 * ((ulong)bVar62 * lVar53 + (ulong)!bVar62 * local_638);
            auVar35._8_8_ = uStack_620;
            auVar35._0_8_ = local_628;
            auVar32._8_8_ = uStack_650;
            auVar32._0_8_ = local_658;
            uVar30 = vcmpsd_avx512f(auVar32,auVar35,1);
            bVar31 = (bool)((byte)uVar30 & 1);
            local_628 = (ulong)bVar31 * (long)local_658 +
                        (ulong)!bVar31 *
                        ((ulong)bVar62 * (long)local_658 + (ulong)!bVar62 * local_628);
            auVar36._8_8_ = uStack_610;
            auVar36._0_8_ = local_618;
            uVar30 = vcmpsd_avx512f(auVar36,auVar32,1);
            bVar31 = (bool)((byte)uVar30 & 1);
            local_618 = (ulong)bVar31 * (long)local_658 +
                        (ulong)!bVar31 *
                        ((ulong)bVar62 * (long)local_658 + (ulong)!bVar62 * local_618);
            auVar37._8_8_ = uStack_600;
            auVar37._0_8_ = local_608;
            uVar30 = vcmpsd_avx512f(local_758,auVar37,1);
            bVar31 = (bool)((byte)uVar30 & 1);
            lVar53 = local_758._0_8_;
            local_608 = (ulong)bVar31 * lVar53 +
                        (ulong)!bVar31 * ((ulong)bVar62 * lVar53 + (ulong)!bVar62 * local_608);
            auVar38._8_8_ = uStack_5f0;
            auVar38._0_8_ = local_5f8;
            uVar30 = vcmpsd_avx512f(auVar38,local_758,1);
            bVar31 = (bool)((byte)uVar30 & 1);
            local_5f8 = (ulong)bVar31 * lVar53 +
                        (ulong)!bVar31 * ((ulong)bVar62 * lVar53 + (ulong)!bVar62 * local_5f8);
            local_7f8 = (ulong)((int)local_7f8 + 1);
            iVar43 = iVar43 + 1;
          } while (iVar43 != (int)local_810);
          local_7f8 = (ulong)local_790 & 0xffffffff;
        }
      }
      lVar53 = std::__cxx11::string::find((char *)&local_838,0xa04919,0);
      cVar40 = (char)(istream *)local_238;
      if (lVar53 == 0) {
        cVar41 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + cVar40);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_238,(string *)&local_838,cVar41);
        uVar42 = atoi(local_838._M_dataplus._M_p);
        printf("Found %d Edges.\n",(ulong)uVar42);
        pCVar45 = GetLog();
        ChStreamOutAscii::operator<<
                  (&pCVar45->super_ChStreamOutAscii,"Parsing edges from \"Edges\" \n");
        cVar41 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + cVar40);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_238,(string *)&local_838,cVar41);
        if (0 < (int)uVar42) {
          uVar57 = 0;
          do {
            local_868 = (ChNodeFEAxyzD *)local_858;
            local_860._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_858[0] = 0;
            std::__cxx11::istringstream::istringstream
                      ((istringstream *)local_538,(string *)&local_838,_S_in);
            lVar53 = 0;
            for (uVar56 = 0;
                (piVar44 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                     ((istream *)local_538,(string *)&local_868,' '),
                ((byte)piVar44[*(long *)(*(long *)piVar44 + -0x18) + 0x20] & 5) == 0 &&
                (uVar56 < 0x14)); uVar56 = uVar56 + 1) {
              std::__cxx11::istringstream::istringstream
                        ((istringstream *)local_3b8,(string *)&local_868,_S_in);
              if ((local_688.m_rows < 1) || (local_688.m_cols <= (long)uVar56)) {
                pcVar50 = 
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<int, -1, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<int, -1, -1, 1>, Level = 1]"
                ;
                goto LAB_0061e766;
              }
              std::istream::operator>>(local_3b8,(int *)((long)local_688.m_data + lVar53));
              std::__cxx11::istringstream::~istringstream((istringstream *)local_3b8);
              std::ios_base::~ios_base(local_340);
              lVar53 = lVar53 + 4;
            }
            if (uVar56 != 3) {
              pCVar48 = (ChException *)__cxa_allocate_exception(0x28);
              std::operator+(local_3b8,"ERROR in .mesh file, Edges require 3 node IDs, see line:\n",
                             &local_838);
              plVar49 = (long *)std::__cxx11::string::append((char *)local_3b8);
              local_598._M_dataplus._M_p = (pointer)*plVar49;
              psVar51 = (size_type *)(plVar49 + 2);
              if ((size_type *)local_598._M_dataplus._M_p == psVar51) {
                local_598.field_2._M_allocated_capacity = *psVar51;
                local_598.field_2._8_8_ = plVar49[3];
                local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
              }
              else {
                local_598.field_2._M_allocated_capacity = *psVar51;
              }
              local_598._M_string_length = plVar49[1];
              *plVar49 = (long)psVar51;
              plVar49[1] = 0;
              *(undefined1 *)(plVar49 + 2) = 0;
              ChException::ChException(pCVar48,&local_598);
              __cxa_throw(pCVar48,&ChException::typeinfo,ChException::~ChException);
            }
            cVar41 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + cVar40);
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)local_238,(string *)&local_838,cVar41);
            std::__cxx11::istringstream::~istringstream((istringstream *)local_538);
            std::ios_base::~ios_base(local_4c0);
            if (local_868 != (ChNodeFEAxyzD *)local_858) {
              operator_delete(local_868,CONCAT71(local_858._1_7_,local_858[0]) + 1);
            }
            uVar57 = uVar57 + 1;
          } while (uVar57 != uVar42);
        }
      }
      lVar53 = std::__cxx11::string::find((char *)&local_838,0x9994ee,0);
      if (lVar53 == 0) {
        cVar41 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + cVar40);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_238,(string *)&local_838,cVar41);
        local_858._20_4_ = atoi(local_838._M_dataplus._M_p);
        printf("Found %d elements.\n",(ulong)(uint)local_858._20_4_);
        pCVar45 = GetLog();
        ChStreamOutAscii::operator<<
                  (&pCVar45->super_ChStreamOutAscii,"Parsing nodeset from \"Quadrilaterals\" \n");
        cVar41 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + cVar40);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_238,(string *)&local_838,cVar41);
        if (0 < (int)local_858._20_4_) {
          local_5d8 = (size_type)(uint)local_858._20_4_;
          sVar59 = 0;
          do {
            local_868 = (ChNodeFEAxyzD *)local_858;
            local_860._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_858[0] = 0;
            std::__cxx11::istringstream::istringstream
                      ((istringstream *)local_538,(string *)&local_838,_S_in);
            __new_size = sVar59 + 1;
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::resize(&local_7c8,__new_size);
            std::vector<int,_std::allocator<int>_>::resize
                      (local_7c8.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + sVar59,5);
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::resize(&local_6e8,__new_size);
            std::vector<double,_std::allocator<double>_>::resize
                      (local_6e8.
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + sVar59,2);
            lVar53 = 0;
            for (uVar56 = 0;
                (piVar44 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                     ((istream *)local_538,(string *)&local_868,' '),
                ((byte)piVar44[*(long *)(*(long *)piVar44 + -0x18) + 0x20] & 5) == 0 &&
                (uVar56 < 0x14)); uVar56 = uVar56 + 1) {
              std::__cxx11::istringstream::istringstream
                        ((istringstream *)local_3b8,(string *)&local_868,_S_in);
              std::istream::operator>>
                        (local_3b8,
                         (int *)((long)local_7c8.
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[sVar59].
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start + lVar53));
              std::__cxx11::istringstream::~istringstream((istringstream *)local_3b8);
              std::ios_base::~ios_base(local_340);
              lVar53 = lVar53 + 4;
            }
            piVar23 = local_7c8.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[sVar59].
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start;
            iVar43 = *piVar23;
            lVar53 = (long)iVar43 + -1;
            peVar24 = local_6a8.
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar53].
                      super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
            dVar72 = *(double *)&(peVar24->super_ChNodeFEAxyz).super_ChNodeFEAbase.field_0x20;
            auVar107._8_8_ = 0;
            auVar107._0_8_ = dVar72;
            dVar73 = *(double *)&(peVar24->super_ChNodeFEAxyz).field_0x28;
            auVar109._8_8_ = 0;
            auVar109._0_8_ = dVar73;
            dVar2 = *(double *)&(peVar24->super_ChNodeFEAxyz).field_0x30;
            auVar111._8_8_ = 0;
            auVar111._0_8_ = dVar2;
            peVar24 = local_6a8.
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[(long)piVar23[1] + -1].
                      super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
            dVar3 = *(double *)&(peVar24->super_ChNodeFEAxyz).super_ChNodeFEAbase.field_0x20;
            auVar89._8_8_ = 0;
            auVar89._0_8_ = dVar3;
            dVar4 = *(double *)&(peVar24->super_ChNodeFEAxyz).field_0x28;
            auVar92._8_8_ = 0;
            auVar92._0_8_ = dVar4;
            dVar5 = *(double *)&(peVar24->super_ChNodeFEAxyz).field_0x30;
            auVar94._8_8_ = 0;
            auVar94._0_8_ = dVar5;
            peVar24 = local_6a8.
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[(long)piVar23[2] + -1].
                      super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
            dVar6 = *(double *)&(peVar24->super_ChNodeFEAxyz).super_ChNodeFEAbase.field_0x20;
            auVar97._8_8_ = 0;
            auVar97._0_8_ = dVar6;
            dVar7 = *(double *)&(peVar24->super_ChNodeFEAxyz).field_0x28;
            auVar99._8_8_ = 0;
            auVar99._0_8_ = dVar7;
            dVar8 = *(double *)&(peVar24->super_ChNodeFEAxyz).field_0x30;
            auVar100._8_8_ = 0;
            auVar100._0_8_ = dVar8;
            peVar24 = local_6a8.
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[(long)piVar23[3] + -1].
                      super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
            dVar9 = *(double *)&(peVar24->super_ChNodeFEAxyz).super_ChNodeFEAbase.field_0x20;
            auVar101._8_8_ = 0;
            auVar101._0_8_ = dVar9;
            dVar10 = *(double *)&(peVar24->super_ChNodeFEAxyz).field_0x28;
            auVar103._8_8_ = 0;
            auVar103._0_8_ = dVar10;
            dVar11 = *(double *)&(peVar24->super_ChNodeFEAxyz).field_0x30;
            auVar105._8_8_ = 0;
            auVar105._0_8_ = dVar11;
            dVar29 = dVar73 - dVar4;
            auVar63 = vsubsd_avx512f(auVar107,auVar101);
            auVar64 = vsubsd_avx512f(auVar109,auVar103);
            auVar65 = vsubsd_avx512f(auVar111,auVar105);
            auVar87._8_8_ = 0;
            auVar87._0_8_ = dVar2 - dVar5;
            auVar66 = vmulsd_avx512f(auVar64,auVar87);
            auVar75._8_8_ = 0;
            auVar75._0_8_ = dVar29;
            auVar66 = vfmsub231sd_avx512f(auVar66,auVar75,auVar65);
            vmovsd_avx512f(auVar65);
            auVar82._8_8_ = 0;
            auVar82._0_8_ = dVar72 - dVar3;
            auVar65 = vmulsd_avx512f(auVar65,auVar82);
            auVar65 = vfmsub231sd_avx512f(auVar65,auVar87,auVar63);
            vmovsd_avx512f(auVar63);
            auVar63 = vmulsd_avx512f(auVar63,auVar75);
            vmovsd_avx512f(auVar64);
            auVar63 = vfmsub231sd_avx512f(auVar63,auVar82,auVar64);
            local_708.
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar53].m_data[0] =
                 auVar66._0_8_ +
                 local_708.
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar53].m_data[0];
            auVar18._8_8_ = 0;
            auVar18._0_8_ =
                 local_708.
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar53].m_data[1];
            auVar64 = vaddsd_avx512f(auVar65,auVar18);
            local_708.
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar53].m_data[1] = auVar64._0_8_;
            auVar19._8_8_ = 0;
            auVar19._0_8_ =
                 local_708.
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar53].m_data[2];
            auVar63 = vaddsd_avx512f(auVar63,auVar19);
            local_708.
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar53].m_data[2] = auVar63._0_8_;
            local_778.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[(long)iVar43 + -1] =
                 local_778.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[(long)iVar43 + -1] + 1;
            auVar63 = vsubsd_avx512f(auVar89,auVar97);
            auVar64 = vsubsd_avx512f(auVar92,auVar99);
            auVar65 = vsubsd_avx512f(auVar94,auVar100);
            auVar66 = vsubsd_avx512f(auVar92,auVar109);
            auVar67 = vsubsd_avx512f(auVar94,auVar111);
            auVar68 = vmulsd_avx512f(auVar66,auVar65);
            auVar68 = vfmsub231sd_avx512f(auVar68,auVar64,auVar67);
            auVar67 = vmulsd_avx512f(auVar67,auVar63);
            vmovsd_avx512f(auVar65);
            auVar113._8_8_ = 0;
            auVar113._0_8_ = dVar3 - dVar72;
            auVar65 = vfmsub231sd_avx512f(auVar67,auVar65,auVar113);
            vmovsd_avx512f(auVar64);
            auVar64 = vmulsd_avx512f(auVar113,auVar64);
            vmovsd_avx512f(auVar63);
            auVar63 = vfmsub231sd_avx512f(auVar64,auVar63,auVar66);
            lVar53 = (long)piVar23[1];
            auVar20._8_8_ = 0;
            auVar20._0_8_ =
                 local_708.
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar53 + -1].m_data[0];
            auVar64 = vaddsd_avx512f(auVar68,auVar20);
            vmovsd_avx512f(auVar64);
            local_708.
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar53 + -1].m_data[0] =
                 local_708.
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar53 + -1].m_data[0];
            auVar21._8_8_ = 0;
            auVar21._0_8_ =
                 local_708.
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar53 + -1].m_data[1];
            auVar64 = vaddsd_avx512f(auVar65,auVar21);
            vmovsd_avx512f(auVar64);
            local_708.
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar53 + -1].m_data[1] =
                 local_708.
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar53 + -1].m_data[1];
            local_708.
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar53 + -1].m_data[2] =
                 auVar63._0_8_ +
                 local_708.
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar53 + -1].m_data[2];
            local_778.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar53 + -1] =
                 local_778.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar53 + -1] + 1;
            auVar69 = vsubsd_avx512f(auVar101,auVar97);
            auVar70 = vsubsd_avx512f(auVar103,auVar99);
            auVar71 = vsubsd_avx512f(auVar105,auVar100);
            auVar112._8_8_ = 0;
            auVar112._0_8_ = dVar11 - dVar2;
            auVar63 = vmulsd_avx512f(auVar70,auVar112);
            auVar110._8_8_ = 0;
            auVar110._0_8_ = dVar10 - dVar73;
            auVar63 = vfmsub231sd_avx512f(auVar63,auVar110,auVar71);
            auVar108._8_8_ = 0;
            auVar108._0_8_ = dVar9 - dVar72;
            auVar64 = vmulsd_avx512f(auVar71,auVar108);
            auVar64 = vfmsub231sd_avx512f(auVar64,auVar69,auVar112);
            auVar65 = vmulsd_avx512f(auVar69,auVar110);
            auVar65 = vfmsub231sd_avx512f(auVar65,auVar70,auVar108);
            lVar53 = (long)piVar23[2];
            local_708.
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar53 + -1].m_data[0] =
                 auVar63._0_8_ +
                 local_708.
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar53 + -1].m_data[0];
            auVar22._8_8_ = 0;
            auVar22._0_8_ =
                 local_708.
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar53 + -1].m_data[1];
            auVar63 = vaddsd_avx512f(auVar64,auVar22);
            local_708.
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar53 + -1].m_data[1] = auVar63._0_8_;
            local_708.
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar53 + -1].m_data[2] =
                 auVar65._0_8_ +
                 local_708.
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar53 + -1].m_data[2];
            local_778.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar53 + -1] =
                 local_778.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar53 + -1] + 1;
            auVar95._8_8_ = 0;
            auVar95._0_8_ = dVar8 - dVar5;
            auVar98._8_8_ = 0;
            auVar98._0_8_ = (dVar8 - dVar11) * (dVar7 - dVar4);
            auVar104._8_8_ = 0;
            auVar104._0_8_ = dVar7 - dVar10;
            auVar63 = vfmsub231sd_fma(auVar98,auVar104,auVar95);
            auVar90._8_8_ = 0;
            auVar90._0_8_ = dVar6 - dVar3;
            auVar96._8_8_ = 0;
            auVar96._0_8_ = (dVar6 - dVar9) * (dVar8 - dVar5);
            auVar106._8_8_ = 0;
            auVar106._0_8_ = dVar8 - dVar11;
            auVar64 = vfmsub231sd_fma(auVar96,auVar90,auVar106);
            auVar91._8_8_ = 0;
            auVar91._0_8_ = (dVar7 - dVar10) * (dVar6 - dVar3);
            auVar93._8_8_ = 0;
            auVar93._0_8_ = dVar7 - dVar4;
            auVar102._8_8_ = 0;
            auVar102._0_8_ = dVar6 - dVar9;
            auVar65 = vfmsub231sd_fma(auVar91,auVar102,auVar93);
            lVar53 = (long)piVar23[3];
            local_708.
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar53 + -1].m_data[0] =
                 auVar63._0_8_ +
                 local_708.
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar53 + -1].m_data[0];
            local_708.
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar53 + -1].m_data[1] =
                 auVar64._0_8_ +
                 local_708.
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar53 + -1].m_data[1];
            local_708.
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar53 + -1].m_data[2] =
                 auVar65._0_8_ +
                 local_708.
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar53 + -1].m_data[2];
            local_778.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar53 + -1] =
                 local_778.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar53 + -1] + 1;
            auVar76._8_8_ = 0;
            auVar76._0_8_ = dVar29 * dVar29;
            auVar83._8_8_ = 0;
            auVar83._0_8_ = dVar72 - dVar3;
            auVar63 = vfmadd231sd_fma(auVar76,auVar83,auVar83);
            auVar88._8_8_ = 0;
            auVar88._0_8_ = dVar2 - dVar5;
            auVar63 = vfmadd231sd_fma(auVar63,auVar88,auVar88);
            uVar61 = auVar63._0_8_ < 0.0;
            if ((bool)uVar61) {
              vmovsd_avx512f(auVar71);
              vmovsd_avx512f(auVar69);
              vmovsd_avx512f(auVar70);
              dVar72 = sqrt(auVar63._0_8_);
              auVar70._8_8_ = 0;
              auVar70._0_8_ = local_5e8;
              auVar69._8_8_ = 0;
              auVar69._0_8_ = local_5e0;
              auVar71._8_8_ = 0;
              auVar71._0_8_ = local_800;
              local_800 = dVar72;
            }
            else {
              auVar63 = vsqrtsd_avx(auVar63,auVar63);
              local_800 = auVar63._0_8_;
            }
            auVar63 = vmulsd_avx512f(auVar70,auVar70);
            auVar63 = vfmadd213sd_avx512f(auVar69,auVar69,auVar63);
            vfmadd213sd_avx512f(auVar71,auVar71,auVar63);
            auVar63 = vucomisd_avx512f(ZEXT816(0));
            if ((bool)uVar61) {
              dVar72 = sqrt(auVar63._0_8_);
            }
            else {
              auVar63 = vsqrtsd_avx512f(auVar63,auVar63);
              dVar72 = auVar63._0_8_;
            }
            local_800 = (local_800 + dVar72) * 0.5;
            auVar84._8_8_ = 0;
            auVar84._0_8_ = local_790;
            auVar77._8_8_ = 0;
            auVar77._0_8_ = local_5c8 * local_5c8;
            auVar63 = vfmadd213sd_fma(auVar84,auVar84,auVar77);
            auVar78._8_8_ = 0;
            auVar78._0_8_ = local_658;
            auVar63 = vfmadd213sd_fma(auVar78,auVar78,auVar63);
            if (auVar63._0_8_ < 0.0) {
              dVar72 = sqrt(auVar63._0_8_);
            }
            else {
              auVar63 = vsqrtsd_avx(auVar63,auVar63);
              dVar72 = auVar63._0_8_;
            }
            auVar85._8_8_ = 0;
            auVar85._0_8_ = local_668._0_8_;
            auVar79._8_8_ = 0;
            auVar79._0_8_ = local_5c0 * local_5c0;
            auVar63 = vfmadd213sd_fma(auVar85,auVar85,auVar79);
            auVar80._8_8_ = 0;
            auVar80._0_8_ = local_758._0_8_;
            auVar63 = vfmadd213sd_fma(auVar80,auVar80,auVar63);
            if (auVar63._0_8_ < 0.0) {
              local_758._0_8_ = dVar72;
              dVar73 = sqrt(auVar63._0_8_);
              dVar72 = (double)local_758._0_8_;
            }
            else {
              auVar63 = vsqrtsd_avx(auVar63,auVar63);
              dVar73 = auVar63._0_8_;
            }
            pdVar25 = local_6e8.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[sVar59].
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            *pdVar25 = local_800;
            pdVar25[1] = (dVar72 + dVar73) * 0.5;
            if (uVar56 != 5) {
              pCVar48 = (ChException *)__cxa_allocate_exception(0x28);
              std::operator+(local_3b8,
                             "ERROR in .mesh file, Quadrilaterals require 4 node IDs, see line:\n",
                             &local_838);
              plVar49 = (long *)std::__cxx11::string::append((char *)local_3b8);
              local_5b8._M_dataplus._M_p = (pointer)*plVar49;
              psVar51 = (size_type *)(plVar49 + 2);
              if ((size_type *)local_5b8._M_dataplus._M_p == psVar51) {
                local_5b8.field_2._M_allocated_capacity = *psVar51;
                local_5b8.field_2._8_8_ = plVar49[3];
                local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
              }
              else {
                local_5b8.field_2._M_allocated_capacity = *psVar51;
              }
              local_5b8._M_string_length = plVar49[1];
              *plVar49 = (long)psVar51;
              plVar49[1] = 0;
              *(undefined1 *)(plVar49 + 2) = 0;
              ChException::ChException(pCVar48,&local_5b8);
              __cxa_throw(pCVar48,&ChException::typeinfo,ChException::~ChException);
            }
            cVar41 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + cVar40);
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)local_238,(string *)&local_838,cVar41);
            std::__cxx11::istringstream::~istringstream((istringstream *)local_538);
            std::ios_base::~ios_base(local_4c0);
            if (local_868 != (ChNodeFEAxyzD *)local_858) {
              operator_delete(local_868,CONCAT71(local_858._1_7_,local_858[0]) + 1);
            }
            sVar59 = __new_size;
          } while (__new_size != local_5d8);
        }
      }
    }
  } while( true );
}

Assistant:

void ChMeshFileLoader::ANCFShellFromGMFFile(std::shared_ptr<ChMesh> mesh,
                                            const char* filename,
                                            std::shared_ptr<ChMaterialShellANCF> my_material,
                                            std::vector<double>& node_ave_area,
                                            std::vector<int>& Boundary_nodes,
                                            ChVector<> pos_transform,
                                            ChMatrix33<> rot_transform,
                                            double scaleFactor,
                                            bool printNodes,
                                            bool printElements) {
    int added_nodes = 0;
    int added_elements = 0;
    double dx, dy;
    int nodes_offset = mesh->GetNnodes();
    printf("Current number of nodes in mesh is %d \n", nodes_offset);
    ChMatrixDynamic<double> nodesXYZ(1, 4);
    ChMatrixDynamic<int> NumBEdges(1, 3);  // To store boundary nodes
    ChMatrixNM<double, 1, 6> BoundingBox;  // (xmin xmax ymin ymax zmin zmax) bounding box of the mesh
    std::vector<ChVector<>> Normals;       // To store the normal vectors
    std::vector<int> num_Normals;
    ChVector<double> pos1, pos2, pos3, pos4;                  // Position of nodes in each element
    ChVector<double> vec1, vec2, vec3;                        // intermediate vectors for calculation of normals
    std::vector<std::shared_ptr<ChNodeFEAxyzD>> nodesVector;  // To store intermediate nodes
    std::vector<std::vector<int>> elementsVector;             // nodes of each element
    std::vector<std::vector<double>> elementsdxdy;            // dx, dy of elements

    int TotalNumNodes = 0, TotalNumElements = 0, TotalNumBEdges = 0;
    BoundingBox.setZero();

    std::ifstream fin(filename);
    if (!fin.good())
        throw ChException("ERROR opening Mesh file: " + std::string(filename) + "\n");

    std::string line;
    while (std::getline(fin, line)) {
        // trims white space from the beginning of the string
        line.erase(line.begin(),
                   std::find_if(line.begin(), line.end(), [](unsigned char c) { return !std::isspace(c); }));

        if (line[0] == 0)
            continue;  // skip empty linesnodes_offset
        if (line.find("Vertices") == 0) {
            std::getline(fin, line);
            TotalNumNodes = atoi(line.c_str());
            printf("Found  %d nodes\n", TotalNumNodes);
            GetLog() << "Parsing information from \"Vertices\" \n";
            std::getline(fin, line);
            Normals.resize(TotalNumNodes);
            node_ave_area.resize(nodes_offset + TotalNumNodes);
            num_Normals.resize(TotalNumNodes);
            for (int inode = 0; inode < TotalNumNodes; inode++) {
                double loc_x, loc_y, loc_z;
                double dir_x, dir_y, dir_z;

                int ntoken = 0;
                std::string token;
                std::istringstream ss(line);
                while (std::getline(ss, token, ' ') && ntoken < 20) {
                    std::istringstream stoken(token);
                    stoken >> nodesXYZ(0, ntoken);
                    nodesXYZ(0, ntoken) *= scaleFactor;
                    ++ntoken;
                }

                loc_x = nodesXYZ(0, 0);
                loc_y = nodesXYZ(0, 1);
                loc_z = nodesXYZ(0, 2);
                dir_x = 1.0;
                dir_y = 1.0;
                dir_z = 1.0;

                ChVector<> node_position(loc_x, loc_y, loc_z);
                node_position = rot_transform * node_position;  // rotate/scale, if needed
                node_position = pos_transform + node_position;  // move, if needed
                auto node = chrono_types::make_shared<ChNodeFEAxyzD>(node_position, ChVector<>(dir_x, dir_y, dir_z));
                nodesVector.push_back(node);

                if (loc_x < BoundingBox(0, 0) || added_nodes == 0)
                    BoundingBox(0, 0) = loc_x;
                if (loc_x > BoundingBox(0, 1) || added_nodes == 0)
                    BoundingBox(0, 1) = loc_x;
                if (loc_y < BoundingBox(0, 2) || added_nodes == 0)
                    BoundingBox(0, 2) = loc_y;
                if (loc_y > BoundingBox(0, 3) || added_nodes == 0)
                    BoundingBox(0, 3) = loc_y;

                if (loc_z < BoundingBox(0, 4) || added_nodes == 0)
                    BoundingBox(0, 4) = loc_z;
                if (loc_z > BoundingBox(0, 5) || added_nodes == 0)
                    BoundingBox(0, 5) = loc_z;
                ++added_nodes;

                if (ntoken != 4)
                    throw ChException("ERROR in .mesh file, Quadrilaterals require 4 node IDs, see line:\n" + line +
                                      "\n");

                std::getline(fin, line);
            }
        }

        // Reading the Boundary nodes ...
        if (line.find("Edges") == 0) {
            std::getline(fin, line);
            TotalNumBEdges = atoi(line.c_str());
            printf("Found %d Edges.\n", TotalNumBEdges);
            GetLog() << "Parsing edges from \"Edges\" \n";
            std::getline(fin, line);

            for (int edge = 0; edge < TotalNumBEdges; edge++) {
                int ntoken = 0;
                std::string token;
                std::istringstream ss(line);
                while (std::getline(ss, token, ' ') && ntoken < 20) {
                    std::istringstream stoken(token);
                    stoken >> NumBEdges(0, ntoken);
                    ++ntoken;
                }

                if (ntoken != 3)
                    throw ChException("ERROR in .mesh file, Edges require 3 node IDs, see line:\n" + line + "\n");

                std::getline(fin, line);
            }
        }

        //
        if (line.find("Quadrilaterals") == 0) {
            std::getline(fin, line);
            TotalNumElements = atoi(line.c_str());
            printf("Found %d elements.\n", TotalNumElements);
            GetLog() << "Parsing nodeset from \"Quadrilaterals\" \n";
            std::getline(fin, line);

            for (int ele = 0; ele < TotalNumElements; ele++) {
                int ntoken = 0;
                std::string token;
                std::istringstream ss(line);
                elementsVector.resize(ele + 1);
                elementsVector[ele].resize(5);
                elementsdxdy.resize(ele + 1);
                elementsdxdy[ele].resize(2);
                while (std::getline(ss, token, ' ') && ntoken < 20) {
                    std::istringstream stoken(token);
                    stoken >> elementsVector[ele][ntoken];
                    ++ntoken;
                }

                // Calculating the true surface normals based on the nodal information
                pos1 = nodesVector[elementsVector[ele][0] - 1]->GetPos();
                pos2 = nodesVector[elementsVector[ele][1] - 1]->GetPos();
                pos4 = nodesVector[elementsVector[ele][2] - 1]->GetPos();
                pos3 = nodesVector[elementsVector[ele][3] - 1]->GetPos();

                // For the first node
                vec1 = (pos1 - pos2);
                vec2 = (pos1 - pos3);
                Normals[elementsVector[ele][0] - 1] += vec1 % vec2;
                num_Normals[elementsVector[ele][0] - 1]++;
                // For the second node
                vec1 = (pos2 - pos4);
                vec2 = (pos2 - pos1);
                Normals[elementsVector[ele][1] - 1] += vec1 % vec2;
                num_Normals[elementsVector[ele][1] - 1]++;
                // For the third node
                vec1 = (pos3 - pos1);
                vec2 = (pos3 - pos4);
                Normals[elementsVector[ele][2] - 1] += vec1 % vec2;
                num_Normals[elementsVector[ele][2] - 1]++;
                // For the forth node
                vec1 = (pos4 - pos3);
                vec2 = (pos4 - pos2);
                Normals[elementsVector[ele][3] - 1] += vec1 % vec2;
                num_Normals[elementsVector[ele][3] - 1]++;

                vec1 = pos1 - pos2;
                vec2 = pos3 - pos4;
                dx = (vec1.Length() + vec2.Length()) / 2;
                vec1 = pos1 - pos3;
                vec2 = pos2 - pos4;
                dy = (vec1.Length() + vec2.Length()) / 2;

                // Set element dimensions
                elementsdxdy[ele][0] = dx;
                elementsdxdy[ele][1] = dy;
                ++added_elements;
                if (ntoken != 5)
                    throw ChException("ERROR in .mesh file, Quadrilaterals require 4 node IDs, see line:\n" + line +
                                      "\n");
                std::getline(fin, line);
            }
        }
    }

    printf("Mesh Bounding box is x [%f %f %f %f %f %f]\n", BoundingBox(0, 0), BoundingBox(0, 1), BoundingBox(0, 2),
           BoundingBox(0, 3), BoundingBox(0, 4), BoundingBox(0, 5));

    GetLog() << "-----------------------------------------------------------\n\n";
    //
    for (int inode = 0; inode < TotalNumNodes; inode++) {
        ChVector<> node_normal = (Normals[inode] / num_Normals[inode]);
        // Very useful information to store: 1/4 of area of neighbouring elements contribute to each node's average area
        node_ave_area[nodes_offset + inode] = Normals[inode].Length() / 4;

        if (num_Normals[inode] <= 2)
            Boundary_nodes.push_back(nodes_offset + inode);
        node_normal.Normalize();

        ChVector<> node_position = nodesVector[inode]->GetPos();
        auto node = chrono_types::make_shared<ChNodeFEAxyzD>(node_position, node_normal);
        node->SetMass(0);
        // Add node to mesh
        mesh->AddNode(node);
        if (printNodes) {
            GetLog() << node->GetPos().x() << "  " << node->GetPos().y() << "  " << node->GetPos().z() << "\n";
        }
    }
    GetLog() << "-----------------------------------------------------------\n";
    for (int ielem = 0; ielem < 0 + TotalNumElements; ielem++) {
        auto element = chrono_types::make_shared<ChElementShellANCF_3423>();
        element->SetNodes(
            std::dynamic_pointer_cast<ChNodeFEAxyzD>(mesh->GetNode(nodes_offset + elementsVector[ielem][0] - 1)),
            std::dynamic_pointer_cast<ChNodeFEAxyzD>(mesh->GetNode(nodes_offset + elementsVector[ielem][1] - 1)),
            std::dynamic_pointer_cast<ChNodeFEAxyzD>(mesh->GetNode(nodes_offset + elementsVector[ielem][2] - 1)),
            std::dynamic_pointer_cast<ChNodeFEAxyzD>(mesh->GetNode(nodes_offset + elementsVector[ielem][3] - 1)));
        dx = elementsdxdy[ielem][0];
        dy = elementsdxdy[ielem][1];
        element->SetDimensions(dx, dy);
        // Add element to mesh
        mesh->AddElement(element);
        if (printElements) {
            std::cout << ielem << " ";
            for (int i = 0; i < 4; i++)
                std::cout << elementsVector[ielem][i] << " ";
            std::cout << std::endl;
        }
    }
}